

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

void cpsm::
     str_cat_impl<char_const*,bool,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
               (stringstream *ss,char **x,bool args,char *args_1,unsigned_long args_2,char *args_3,
               unsigned_long args_4,char *args_5,unsigned_long args_6,char *args_7,
               unsigned_long args_8,char *args_9,unsigned_long args_10,char *args_11,
               unsigned_long args_12,char *args_13,unsigned_long args_14)

{
  stringstream *in_RCX;
  unsigned_long unaff_RBP;
  undefined8 *in_RSI;
  long in_RDI;
  bool *in_R8;
  char *in_R9;
  char *unaff_R15;
  char *unaff_retaddr;
  unsigned_long in_stack_00000008;
  char *in_stack_00000010;
  unsigned_long in_stack_00000018;
  char *in_stack_00000020;
  unsigned_long in_stack_00000028;
  char *in_stack_00000030;
  unsigned_long in_stack_00000038;
  unsigned_long in_stack_00000050;
  
  std::operator<<((ostream *)(in_RDI + 0x10),(char *)*in_RSI);
  str_cat_impl<bool,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
            (in_RCX,in_R8,in_R9,(unsigned_long)args_3,args_3,in_stack_00000050,unaff_R15,unaff_RBP,
             unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
             in_stack_00000028,in_stack_00000030,in_stack_00000038);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}